

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O2

void __thiscall QOpenGLWindowPrivate::initialize(QOpenGLWindowPrivate *this)

{
  QOpenGLWindow *window;
  QSurfaceFormat *pQVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  QOpenGLContext *this_00;
  QOpenGLWindowPaintDevice *this_01;
  long in_FS_OFFSET;
  undefined4 local_50;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined4 local_3c;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->context).d == (QOpenGLContext *)0x0) {
    window = *(QOpenGLWindow **)&this->field_0x8;
    lVar4 = QWindow::handle();
    if (lVar4 == 0) {
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::warning((char *)&local_50);
    }
    this_00 = (QOpenGLContext *)operator_new(0x10);
    QOpenGLContext::QOpenGLContext(this_00,(QObject *)0x0);
    QScopedPointer<QOpenGLContext,_QScopedPointerDeleter<QOpenGLContext>_>::reset
              (&this->context,this_00);
    QOpenGLContext::setShareContext((this->context).d);
    pQVar1 = (QSurfaceFormat *)(this->context).d;
    QWindow::requestedFormat();
    QOpenGLContext::setFormat(pQVar1);
    QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)&local_50);
    cVar2 = QOpenGLContext::create();
    if (cVar2 == '\0') {
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::warning
                ((char *)&local_50,"QOpenGLWindow::beginPaint: Failed to create context");
    }
    cVar2 = QOpenGLContext::makeCurrent((QSurface *)(this->context).d);
    if (cVar2 == '\0') {
      local_50 = 2;
      local_3c = 0;
      local_4c = 0;
      uStack_44 = 0;
      local_38 = "default";
      QMessageLogger::warning
                ((char *)&local_50,"QOpenGLWindow::beginPaint: Failed to make context current");
    }
    this_01 = (QOpenGLWindowPaintDevice *)operator_new(0x20);
    QOpenGLWindowPaintDevice::QOpenGLWindowPaintDevice(this_01,window);
    QScopedPointer<QOpenGLWindowPaintDevice,_QScopedPointerDeleter<QOpenGLWindowPaintDevice>_>::
    reset(&this->paintDevice,this_01);
    if (this->updateBehavior == PartialUpdateBlit) {
      bVar3 = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();
      this->hasFboBlit = bVar3;
    }
    (**(code **)(*(long *)window + 0x138))(window);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLWindowPrivate::initialize()
{
    Q_Q(QOpenGLWindow);

    if (context)
        return;

    if (!q->handle())
        qWarning("Attempted to initialize QOpenGLWindow without a platform window");

    context.reset(new QOpenGLContext);
    context->setShareContext(shareContext);
    context->setFormat(q->requestedFormat());
    if (!context->create())
        qWarning("QOpenGLWindow::beginPaint: Failed to create context");
    if (!context->makeCurrent(q))
        qWarning("QOpenGLWindow::beginPaint: Failed to make context current");

    paintDevice.reset(new QOpenGLWindowPaintDevice(q));
    if (updateBehavior == QOpenGLWindow::PartialUpdateBlit)
        hasFboBlit = QOpenGLFramebufferObject::hasOpenGLFramebufferBlit();

    q->initializeGL();
}